

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Encode.cpp
# Opt level: O3

void idx2::Dealloc(channel *C)

{
  allocator *paVar1;
  
  paVar1 = (C->BrickDeltasStream).Stream.Alloc;
  (*paVar1->_vptr_allocator[1])(paVar1,C);
  paVar1 = (C->BrickSizeStream).Stream.Alloc;
  (C->BrickDeltasStream).BitPtr = (C->BrickDeltasStream).Stream.Data;
  (C->BrickDeltasStream).BitPos = 0;
  (C->BrickDeltasStream).BitBuf = 0;
  (*paVar1->_vptr_allocator[1])(paVar1,&C->BrickSizeStream);
  paVar1 = (C->BrickStream).Stream.Alloc;
  (C->BrickSizeStream).BitPtr = (C->BrickSizeStream).Stream.Data;
  (C->BrickSizeStream).BitPos = 0;
  (C->BrickSizeStream).BitBuf = 0;
  (*paVar1->_vptr_allocator[1])(paVar1,&C->BrickStream);
  paVar1 = (C->BlockStream).Stream.Alloc;
  (C->BrickStream).BitPtr = (C->BrickStream).Stream.Data;
  (C->BrickStream).BitPos = 0;
  (C->BrickStream).BitBuf = 0;
  (*paVar1->_vptr_allocator[1])(paVar1,&C->BlockStream);
  (C->BlockStream).BitPtr = (C->BlockStream).Stream.Data;
  (C->BlockStream).BitPos = 0;
  (C->BlockStream).BitBuf = 0;
  return;
}

Assistant:

void
Dealloc(channel* C)
{
  Dealloc(&C->BrickDeltasStream);
  Dealloc(&C->BrickSizeStream);
  Dealloc(&C->BrickStream);
  Dealloc(&C->BlockStream);
}